

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  uint8_t *ptr;
  uint64_t v_local;
  char *dst_local;
  
  ptr = (uint8_t *)dst;
  for (v_local = v; 0x7f < v_local; v_local = v_local >> 7) {
    *ptr = (byte)v_local | 0x80;
    ptr = ptr + 1;
  }
  *ptr = (byte)v_local;
  return (char *)(ptr + 1);
}

Assistant:

char* EncodeVarint64(char* dst, uint64_t v) {
  static const int B = 128;
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  while (v >= B) {
    *(ptr++) = v | B;
    v >>= 7;
  }
  *(ptr++) = static_cast<uint8_t>(v);
  return reinterpret_cast<char*>(ptr);
}